

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageOperations.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayImageOpCompute::configureProgram(TextureCubeMapArrayImageOpCompute *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *this_00;
  NotSupportedError *pNVar6;
  char *local_c0;
  char *fsCode_4;
  char *tesCode_1;
  char *tcsCode_1;
  char *vsCode_4;
  char *fsCode_3;
  char *tesCode;
  char *tcsCode;
  char *vsCode_3;
  char *fsCode_2;
  char *gsCode;
  char *vsCode_2;
  char *fsCode_1;
  char *vsCode_1;
  char *fsCode;
  char *vsCode;
  char *local_38;
  char *csCode;
  Functions *gl;
  TextureCubeMapArrayImageOpCompute *this_local;
  
  gl = (Functions *)this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  csCode = (char *)CONCAT44(extraout_var,iVar2);
  switch(this->m_shader_to_check) {
  case STC_COMPUTE_SHADER:
    GVar3 = (**(code **)(csCode + 0x3f0))(0x91b9);
    this->m_cs_id = GVar3;
    dVar4 = (**(code **)(csCode + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x308);
    local_38 = getComputeShaderCode(this);
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id,this->m_cs_id,1,&local_38,(bool *)0x0
                      );
    if (!bVar1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Could not create a program from valid compute shader code!",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                 ,0x30f);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    break;
  case STC_FRAGMENT_SHADER:
    GVar3 = (**(code **)(csCode + 0x3f0))(0x8b31);
    this->m_vs_id = GVar3;
    dVar4 = (**(code **)(csCode + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x329);
    GVar3 = (**(code **)(csCode + 0x3f0))(0x8b30);
    this->m_fs_id = GVar3;
    dVar4 = (**(code **)(csCode + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x32b);
    fsCode_1 = getVertexShaderCodeBoilerPlate(this);
    vsCode_2 = getFragmentShaderCode(this);
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,&vsCode_2,
                       this->m_vs_id,1,&fsCode_1,(bool *)0x0);
    if (!bVar1) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar6,
                 "imageCubeArray/iimageCubeArray/uimageCubeArray are not supported by Fragment Shader"
                 ,"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                 ,0x335);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    break;
  case STC_GEOMETRY_SHADER:
    GVar3 = (**(code **)(csCode + 0x3f0))(0x8b31);
    this->m_vs_id = GVar3;
    dVar4 = (**(code **)(csCode + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x33c);
    GVar3 = (**(code **)(csCode + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
    this->m_gs_id = GVar3;
    dVar4 = (**(code **)(csCode + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x33e);
    GVar3 = (**(code **)(csCode + 0x3f0))(0x8b30);
    this->m_fs_id = GVar3;
    dVar4 = (**(code **)(csCode + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x340);
    gsCode = getVertexShaderCodeBoilerPlate(this);
    fsCode_2 = getGeometryShaderCode(this);
    vsCode_3 = getFragmentShaderCodeBoilerPlate(this);
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,&vsCode_3,
                       this->m_gs_id,1,&fsCode_2,this->m_vs_id,1,&gsCode,(bool *)0x0);
    if (!bVar1) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar6,
                 "imageCubeArray/iimageCubeArray/uimageCubeArray are not supported by Geometry Shader"
                 ,"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                 ,0x34c);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    break;
  case STC_TESSELLATION_CONTROL_SHADER:
    GVar3 = (**(code **)(csCode + 0x3f0))(0x8b31);
    this->m_vs_id = GVar3;
    dVar4 = (**(code **)(csCode + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x353);
    GVar3 = (**(code **)(csCode + 0x3f0))
                      ((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER);
    this->m_tc_id = GVar3;
    dVar4 = (**(code **)(csCode + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x355);
    GVar3 = (**(code **)(csCode + 0x3f0))
                      ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
    this->m_te_id = GVar3;
    dVar4 = (**(code **)(csCode + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x357);
    GVar3 = (**(code **)(csCode + 0x3f0))(0x8b30);
    this->m_fs_id = GVar3;
    dVar4 = (**(code **)(csCode + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x359);
    tcsCode = getVertexShaderCodeBoilerPlate(this);
    tesCode = getTessControlShaderCode(this);
    fsCode_3 = getTessEvaluationShaderCodeBoilerPlate(this);
    vsCode_4 = getFragmentShaderCodeBoilerPlate(this);
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,&vsCode_4,
                       this->m_tc_id,1,&tesCode,this->m_te_id,1,&fsCode_3,this->m_vs_id,1,&tcsCode,
                       (bool *)0x0);
    if (!bVar1) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar6,
                 "imageCubeArray/iimageCubeArray/uimageCubeArray are not supported by Tessellation Control Shader"
                 ,"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                 ,0x366);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    break;
  case STC_TESSELLATION_EVALUATION_SHADER:
    GVar3 = (**(code **)(csCode + 0x3f0))(0x8b31);
    this->m_vs_id = GVar3;
    dVar4 = (**(code **)(csCode + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x36d);
    GVar3 = (**(code **)(csCode + 0x3f0))
                      ((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER);
    this->m_tc_id = GVar3;
    dVar4 = (**(code **)(csCode + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x36f);
    GVar3 = (**(code **)(csCode + 0x3f0))
                      ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
    this->m_te_id = GVar3;
    dVar4 = (**(code **)(csCode + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x371);
    GVar3 = (**(code **)(csCode + 0x3f0))(0x8b30);
    this->m_fs_id = GVar3;
    dVar4 = (**(code **)(csCode + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x373);
    tcsCode_1 = getVertexShaderCodeBoilerPlate(this);
    tesCode_1 = getTessControlShaderCodeBoilerPlate(this);
    fsCode_4 = getTessEvaluationShaderCode(this);
    local_c0 = getFragmentShaderCodeBoilerPlate(this);
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,&local_c0,
                       this->m_tc_id,1,&tesCode_1,this->m_te_id,1,&fsCode_4,this->m_vs_id,1,
                       &tcsCode_1,(bool *)0x0);
    if (!bVar1) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar6,
                 "imageCubeArray/iimageCubeArray/uimageCubeArray are not supported by Tessellation Evaluation Shader"
                 ,"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                 ,0x380);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    break;
  case STC_VERTEX_SHADER:
    GVar3 = (**(code **)(csCode + 0x3f0))(0x8b31);
    this->m_vs_id = GVar3;
    dVar4 = (**(code **)(csCode + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x316);
    GVar3 = (**(code **)(csCode + 0x3f0))(0x8b30);
    this->m_fs_id = GVar3;
    dVar4 = (**(code **)(csCode + 0x800))();
    glu::checkError(dVar4,"Could not create shader object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x318);
    fsCode = getVertexShaderCode(this);
    vsCode_1 = getFragmentShaderCodeBoilerPlate(this);
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,&vsCode_1,
                       this->m_vs_id,1,&fsCode,(bool *)0x0);
    if (!bVar1) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar6,
                 "imageCubeArray/iimageCubeArray/uimageCubeArray are not supported by Vertex Shader"
                 ,"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                 ,0x322);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  return;
}

Assistant:

void TextureCubeMapArrayImageOpCompute::configureProgram(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	switch (m_shader_to_check)
	{
	case STC_COMPUTE_SHADER:
	{
		m_cs_id = gl.createShader(GL_COMPUTE_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");

		const char* csCode = getComputeShaderCode();

		/* Images are required for compute shader */
		if (!buildProgram(m_po_id, m_cs_id, 1 /* part */, &csCode))
		{
			TCU_FAIL("Could not create a program from valid compute shader code!");
		}
		break;
	}
	case STC_VERTEX_SHADER:
	{
		m_vs_id = gl.createShader(GL_VERTEX_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");
		m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");

		const char* vsCode = getVertexShaderCode();
		const char* fsCode = getFragmentShaderCodeBoilerPlate();

		/* Execute test only if images are supported by vertex shader */
		if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &fsCode, m_vs_id, 1 /* part */, &vsCode))
		{
			throw tcu::NotSupportedError(
				"imageCubeArray/iimageCubeArray/uimageCubeArray are not supported by Vertex Shader", "", __FILE__,
				__LINE__);
		}
		break;
	}
	case STC_FRAGMENT_SHADER:
	{
		m_vs_id = gl.createShader(GL_VERTEX_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");
		m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");

		const char* vsCode = getVertexShaderCodeBoilerPlate();
		const char* fsCode = getFragmentShaderCode();

		/* Execute test only if images are supported by fragment shader */
		if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &fsCode, m_vs_id, 1 /* part */, &vsCode))
		{
			throw tcu::NotSupportedError(
				"imageCubeArray/iimageCubeArray/uimageCubeArray are not supported by Fragment Shader", "", __FILE__,
				__LINE__);
		}
		break;
	}
	case STC_GEOMETRY_SHADER:
	{
		m_vs_id = gl.createShader(GL_VERTEX_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");
		m_gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");
		m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");

		const char* vsCode = getVertexShaderCodeBoilerPlate();
		const char* gsCode = getGeometryShaderCode();
		const char* fsCode = getFragmentShaderCodeBoilerPlate();

		/* Execute test only if images are supported by geometry shader */
		if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &fsCode, m_gs_id, 1 /* part */, &gsCode, m_vs_id,
						  1 /* part */, &vsCode))
		{
			throw tcu::NotSupportedError(
				"imageCubeArray/iimageCubeArray/uimageCubeArray are not supported by Geometry Shader", "", __FILE__,
				__LINE__);
		}
		break;
	}
	case STC_TESSELLATION_CONTROL_SHADER:
	{
		m_vs_id = gl.createShader(GL_VERTEX_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");
		m_tc_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");
		m_te_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");
		m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");

		const char* vsCode  = getVertexShaderCodeBoilerPlate();
		const char* tcsCode = getTessControlShaderCode();
		const char* tesCode = getTessEvaluationShaderCodeBoilerPlate();
		const char* fsCode  = getFragmentShaderCodeBoilerPlate();

		/* Execute test only if images are supported by tessellation control shader */
		if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &fsCode, m_tc_id, 1 /* part */, &tcsCode, m_te_id,
						  1 /* part */, &tesCode, m_vs_id, 1 /* part */, &vsCode))
		{
			throw tcu::NotSupportedError(
				"imageCubeArray/iimageCubeArray/uimageCubeArray are not supported by Tessellation Control Shader", "",
				__FILE__, __LINE__);
		}
		break;
	}
	case STC_TESSELLATION_EVALUATION_SHADER:
	{
		m_vs_id = gl.createShader(GL_VERTEX_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");
		m_tc_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");
		m_te_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");
		m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader object!");

		const char* vsCode  = getVertexShaderCodeBoilerPlate();
		const char* tcsCode = getTessControlShaderCodeBoilerPlate();
		const char* tesCode = getTessEvaluationShaderCode();
		const char* fsCode  = getFragmentShaderCodeBoilerPlate();

		/* Execute test only if images are supported by tessellation evaluation shader */
		if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &fsCode, m_tc_id, 1 /* part */, &tcsCode, m_te_id,
						  1 /* part */, &tesCode, m_vs_id, 1 /* part */, &vsCode))
		{
			throw tcu::NotSupportedError(
				"imageCubeArray/iimageCubeArray/uimageCubeArray are not supported by Tessellation Evaluation Shader",
				"", __FILE__, __LINE__);
		}
		break;
	}
	default:
		break;
	}
}